

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

void __thiscall xmrig::Api::Api(Api *this,Base *base)

{
  _func_int **pp_Var1;
  Config *this_00;
  Base *in_RSI;
  IBaseListener *in_RDI;
  String *in_stack_000000a8;
  Api *in_stack_000000b0;
  IBaseListener *in_stack_ffffffffffffff98;
  Base *in_stack_ffffffffffffffa0;
  
  IBaseListener::IBaseListener(in_RDI);
  in_RDI->_vptr_IBaseListener = (_func_int **)&PTR__Api_002b75f0;
  in_RDI[1]._vptr_IBaseListener = (_func_int **)in_RSI;
  in_RDI[4]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[5]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[2]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[3]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0x14]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0x15]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0x12]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0x13]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0x10]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0x11]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0xe]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0xf]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0xc]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0xd]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[10]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[0xb]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[8]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[9]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[6]._vptr_IBaseListener = (_func_int **)0x0;
  in_RDI[7]._vptr_IBaseListener = (_func_int **)0x0;
  pp_Var1 = (_func_int **)Chrono::currentMSecsSinceEpoch();
  in_RDI[0x16]._vptr_IBaseListener = pp_Var1;
  in_RDI[0x17]._vptr_IBaseListener = (_func_int **)0x0;
  std::vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>::vector
            ((vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_> *)0x1df0a3);
  Base::addListener(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = Base::config(in_RSI);
  BaseConfig::apiId(&this_00->super_BaseConfig);
  genId(in_stack_000000b0,in_stack_000000a8);
  return;
}

Assistant:

xmrig::Api::Api(Base *base) :
    m_base(base),
    m_id(),
    m_workerId(),
    m_timestamp(Chrono::currentMSecsSinceEpoch()),
    m_httpd(nullptr)
{
    base->addListener(this);

    genId(base->config()->apiId());
}